

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

float Jf_CutFlow(Jf_Man_t *p,int *pCut)

{
  int i;
  uint i_00;
  float fVar1;
  float fVar2;
  
  fVar2 = 0.0;
  for (i_00 = 1; i_00 <= (*pCut & 0xfU); i_00 = i_00 + 1) {
    i = Jf_CutVar(pCut,i_00);
    fVar1 = Vec_FltEntry(&p->vFlow,i);
    fVar2 = fVar2 + fVar1;
  }
  if (0.0 <= fVar2) {
    return fVar2;
  }
  __assert_fail("Flow >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
}

Assistant:

static inline float Jf_CutFlow( Jf_Man_t * p, int * pCut )
{
    float Flow = 0; int i; 
    for ( i = 1; i <= Jf_CutSize(pCut); i++ )
        Flow += Jf_ObjFlow( p, Jf_CutVar(pCut, i) );
    assert( Flow >= 0 );
    return Flow; 
}